

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonObjectFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  u32 N;
  uchar *zIn;
  u32 n;
  char *z;
  JsonString jx;
  int i;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  if ((argc & 1U) == 0) {
    jsonInit((JsonString *)&z,ctx);
    jsonAppendChar((JsonString *)&z,'{');
    jx.zSpace[0x62] = '\0';
    jx.zSpace[99] = '\0';
    jx._134_2_ = 0;
    for (; (int)jx._132_4_ < argc; jx._132_4_ = jx._132_4_ + 2) {
      iVar1 = sqlite3_value_type(argv[(int)jx._132_4_]);
      if (iVar1 != 3) {
        sqlite3_result_error(ctx,"json_object() labels must be TEXT",-1);
        jsonReset((JsonString *)&z);
        return;
      }
      jsonAppendSeparator((JsonString *)&z);
      zIn = sqlite3_value_text(argv[(int)jx._132_4_]);
      N = sqlite3_value_bytes(argv[(int)jx._132_4_]);
      jsonAppendString((JsonString *)&z,(char *)zIn,N);
      jsonAppendChar((JsonString *)&z,':');
      jsonAppendValue((JsonString *)&z,argv[jx._132_4_ + 1]);
    }
    jsonAppendChar((JsonString *)&z,'}');
    jsonResult((JsonString *)&z);
    sqlite3_result_subtype(ctx,0x4a);
  }
  else {
    sqlite3_result_error(ctx,"json_object() requires an even number of arguments",-1);
  }
  return;
}

Assistant:

static void jsonObjectFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  JsonString jx;
  const char *z;
  u32 n;

  if( argc&1 ){
    sqlite3_result_error(ctx, "json_object() requires an even number "
                                  "of arguments", -1);
    return;
  }
  jsonInit(&jx, ctx);
  jsonAppendChar(&jx, '{');
  for(i=0; i<argc; i+=2){
    if( sqlite3_value_type(argv[i])!=SQLITE_TEXT ){
      sqlite3_result_error(ctx, "json_object() labels must be TEXT", -1);
      jsonReset(&jx);
      return;
    }
    jsonAppendSeparator(&jx);
    z = (const char*)sqlite3_value_text(argv[i]);
    n = (u32)sqlite3_value_bytes(argv[i]);
    jsonAppendString(&jx, z, n);
    jsonAppendChar(&jx, ':');
    jsonAppendValue(&jx, argv[i+1]);
  }
  jsonAppendChar(&jx, '}');
  jsonResult(&jx);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}